

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_z5_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
                *matrix)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  setcont;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  pair<unsigned_int,_unsigned_int> local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  pair<unsigned_int,_unsigned_int> local_58;
  pair<unsigned_int,_unsigned_int> local_50;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.first = 0;
  local_78.second = 1;
  uStack_70 = 1;
  uStack_6c = 2;
  local_68 = 3;
  uStack_64 = 3;
  uStack_60 = 5;
  uStack_5c = 4;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,&local_78,&local_58);
  local_78.first = 1;
  local_78.second = 2;
  uStack_70 = 0;
  uStack_6c = 3;
  local_68 = 0;
  uStack_64 = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  local_78.first = 0;
  local_78.second = 4;
  uStack_70 = 1;
  uStack_6c = 2;
  local_68 = 2;
  uStack_64 = 1;
  uStack_60 = 5;
  uStack_5c = 1;
  local_58.first = 6;
  local_58.second = 1;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,&local_78,&local_50);
  local_68 = 0;
  uStack_64 = 1;
  uStack_60 = 1;
  local_78.first = 4;
  local_78.second = 2;
  uStack_70 = 1;
  uStack_6c = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  local_78.first = 0;
  local_78.second = 1;
  uStack_70 = 1;
  uStack_6c = 3;
  local_68 = 2;
  uStack_64 = 4;
  uStack_60 = 5;
  uStack_5c = 4;
  local_58.first = 6;
  local_58.second = 4;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,&local_78,&local_50);
  local_68 = 0;
  uStack_64 = 4;
  uStack_60 = 4;
  local_78.first = 1;
  local_78.second = 3;
  uStack_70 = 4;
  uStack_6c = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,(pair<unsigned_int,_unsigned_int> *)0x0,
             (pair<unsigned_int,_unsigned_int> *)0x0);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,0,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  local_78.first = 0;
  local_78.second = 1;
  uStack_70 = 1;
  uStack_6c = 2;
  local_68 = 3;
  uStack_64 = 3;
  uStack_60 = 5;
  uStack_5c = 4;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,&local_78,&local_58);
  local_78.first = 1;
  local_78.second = 2;
  uStack_70 = 0;
  uStack_6c = 3;
  local_68 = 0;
  uStack_64 = 4;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  local_78.first = 0;
  local_78.second = 4;
  uStack_70 = 1;
  uStack_6c = 2;
  local_68 = 2;
  uStack_64 = 1;
  uStack_60 = 5;
  uStack_5c = 1;
  local_58.first = 6;
  local_58.second = 1;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_48,&local_78,&local_50);
  local_68 = 0;
  uStack_64 = 1;
  uStack_60 = 1;
  local_78.first = 4;
  local_78.second = 2;
  uStack_70 = 1;
  uStack_6c = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_48,&local_98);
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void column_test_common_z5_content_access(std::vector<Column>& matrix) {
  std::set<std::pair<unsigned int, typename Column::Field_element> > setcont;
  std::vector<typename Column::Field_element> veccont;

  setcont = {{0, 1}, {1, 2}, {3, 3}, {5, 4}};
  veccont = {1, 2, 0, 3, 0, 4};
  column_test_common_content_access(matrix[0], setcont, veccont);

  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[1], setcont, veccont);

  setcont = {{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}};
  veccont = {1, 3, 4, 0, 0, 4, 4};
  column_test_common_content_access(matrix[2], setcont, veccont);

  setcont = {};
  veccont = {};
  column_test_common_content_access(matrix[3], setcont, veccont);

  setcont = {{0, 1}, {1, 2}, {3, 3}, {5, 4}};
  veccont = {1, 2, 0, 3, 0, 4};
  column_test_common_content_access(matrix[4], setcont, veccont);

  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
}